

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxReturnStatement::Emit(FxReturnStatement *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  int opb;
  ExpEmit reg;
  ulong uVar2;
  uint uVar3;
  uint opc;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint extraout_var;
  
  pFVar1 = this->Value;
  if (pFVar1 == (FxExpression *)0x0) {
    uVar4 = 0;
    VMFunctionBuilder::Emit(build,0x4e,0x80,0x80,0);
    uVar3 = 0x80;
    iVar5 = 1;
    uVar6 = 0;
    uVar2 = 0;
    reg.RegNum = 0;
    reg.RegType = '\0';
    reg.RegCount = '\0';
    reg.Konst = false;
    reg.Fixed = false;
    reg.Final = false;
    reg.Target = false;
  }
  else {
    reg._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
    reg.Konst = (bool)(char)extraout_var;
    reg.Fixed = (bool)(char)(extraout_var >> 8);
    reg.Final = (bool)(char)(extraout_var >> 0x10);
    reg.Target = (bool)(char)(extraout_var >> 0x18);
    uVar3 = reg._2_4_;
    iVar5 = reg._3_4_;
    uVar2 = (ulong)extraout_var;
    uVar6 = (ulong)(extraout_var >> 8);
    uVar4 = (ulong)(extraout_var >> 0x18);
    if ((extraout_var & 0x10000) == 0) {
      if (this->Value->ValueType == &TypeVoid->super_PType) {
        opb = 0x80;
        opc = 0;
      }
      else {
        opb = EncodeRegType(reg);
        opc = reg._0_4_ & 0xffff;
      }
      VMFunctionBuilder::Emit(build,0x4e,0x80,opb,opc);
    }
  }
  return (ExpEmit)((ulong)reg & 0xffff |
                   (ulong)((uVar3 & 0xff) << 0x10) |
                   (ulong)(uint)(iVar5 << 0x18) |
                   (uVar2 & 0xff) << 0x20 | (uVar6 & 0xff) << 0x28 | uVar4 << 0x38 | 0x1000000000000
                  );
}

Assistant:

ExpEmit FxReturnStatement::Emit(VMFunctionBuilder *build)
{
	ExpEmit out(0, REGT_NIL);

	// If we return nothing, use a regular RET opcode.
	// Otherwise just return the value we're given.
	if (Value == nullptr)
	{
		build->Emit(OP_RET, RET_FINAL, REGT_NIL, 0);
	}
	else
	{
		out = Value->Emit(build);

		// Check if it is a function call that simplified itself
		// into a tail call in which case we don't emit anything.
		if (!out.Final)
		{
			if (Value->ValueType == TypeVoid)
			{ // Nothing is returned.
				build->Emit(OP_RET, RET_FINAL, REGT_NIL, 0);
			}
			else
			{
				build->Emit(OP_RET, RET_FINAL, EncodeRegType(out), out.RegNum);
			}
		}
	}

	out.Final = true;
	return out;
}